

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

int __thiscall
QDateTimeParser::findDay
          (QDateTimeParser *this,QStringView str,int startDay,int sectionIndex,QString *usedDay,
          int *used)

{
  long lVar1;
  bool bVar2;
  int in_ECX;
  ShortVector<QString> *in_RDI;
  undefined4 in_R8D;
  int *in_R9;
  long in_FS_OFFSET;
  int index;
  int day;
  FormatType type;
  SectionNode *sn;
  QLocale l;
  ShortVector<QString> daysOfWeek;
  QString *in_stack_fffffffffffffdc8;
  enum_type in_stack_fffffffffffffdd0;
  enum_type in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  QMessageLogger *in_stack_fffffffffffffde0;
  QVarLengthArray<QString,_13LL> *this_00;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int local_208;
  int iVar3;
  ShortVector<QString> *entries;
  int local_1cc;
  QStringView in_stack_fffffffffffffe50;
  undefined1 *local_198;
  QMessageLogger local_190;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_16c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entries = in_RDI;
  sectionNode((QDateTimeParser *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
              (int)((ulong)in_RDI >> 0x20));
  local_16c.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       ::operator&(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0);
  bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_16c);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    (*(code *)((QLocalePrivate *)(in_RDI->super_QVLABase<QString>).super_QVLABaseBase.a)[1].m_index)
              (&local_198);
    this_00 = (QVarLengthArray<QString,_13LL> *)&stack0xfffffffffffffea8;
    memset(this_00,0xaa,0x150);
    QVarLengthArray<QString,_13LL>::QVarLengthArray(this_00);
    local_208 = in_ECX;
    QVarLengthArray<QString,_13LL>::reserve
              (this_00,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    iVar3 = local_208;
    for (; local_208 < 8; local_208 = local_208 + 1) {
      QLocale::dayName((QLocale *)in_RDI,(int)((ulong)this_00 >> 0x20),(FormatType)this_00);
      QVarLengthArray<QString,_13LL>::append
                ((QVarLengthArray<QString,_13LL> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
      QString::~QString((QString *)0x76e4d7);
    }
    local_1cc = findTextEntry(in_stack_fffffffffffffe50,entries,(QString *)CONCAT44(iVar3,in_R8D),
                              in_R9);
    if (-1 < local_1cc) {
      local_1cc = local_1cc + iVar3;
    }
    QVarLengthArray<QString,_13LL>::~QVarLengthArray(this_00);
    QLocale::~QLocale((QLocale *)0x76e59d);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffde0,
               (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd4,(char *)in_stack_fffffffffffffdc8);
    QMessageLogger::warning(&local_190,"QDateTimeParser::findDay Internal error");
    local_1cc = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1cc;
}

Assistant:

int QDateTimeParser::findDay(QStringView str, int startDay, int sectionIndex, QString *usedDay, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (!(sn.type & DaySectionMask)) {
        qWarning("QDateTimeParser::findDay Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 4 ? QLocale::LongFormat : QLocale::ShortFormat;
    QLocale l = locale();
    ShortVector<QString> daysOfWeek;
    daysOfWeek.reserve(8 - startDay);
    for (int day = startDay; day <= 7; ++day)
        daysOfWeek.append(l.dayName(day, type));

    const int index = findTextEntry(str, daysOfWeek, usedDay, used);
    return index < 0 ? index : index + startDay;
}